

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O2

void wiz_proj_demo(void)

{
  menu_conflict *menu;
  region_conflict loc;
  
  menu = menu_new(MN_SKIN_SCROLL,&proj_iter);
  loc.col = 0;
  loc.row = 0;
  loc.width = 0;
  loc.page_rows = 0;
  menu_setpriv(menu,0x3e,(void *)0x0);
  menu->title = "PROJ_ types display";
  menu_layout(menu,&loc);
  screen_save();
  clear_from(L'\0');
  menu_select(menu,0,false);
  screen_load();
  mem_free(menu);
  return;
}

Assistant:

void wiz_proj_demo(void)
{
	struct menu *m = menu_new(MN_SKIN_SCROLL, &proj_iter);
	region loc = { 0, 0, 0, 0 };

	menu_setpriv(m, PROJ_MAX, NULL);

	m->title = "PROJ_ types display";
	menu_layout(m, &loc);

	screen_save();
	clear_from(0);
	menu_select(m, 0, false);
	screen_load();
	mem_free(m);
}